

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDebuggerAdapterPipe.cxx
# Opt level: O3

bool testProtocolWithPipes(void)

{
  pointer pCVar1;
  future_status fVar2;
  int iVar3;
  TypeInfo *pTVar4;
  ostream *poVar5;
  Session SVar6;
  pointer *__ptr;
  promise<bool> *__state;
  CMakeInitializeRequest *pCVar7;
  promise<void> *this;
  unique_lock *puVar8;
  bool bVar9;
  seconds futureTimeout;
  ConfigurationDoneRequest configurationDoneRequest;
  shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX> client2Debugger;
  ScopedThread debuggerThread;
  future<dap::ResponseOrError<dap::CMakeInitializeResponse>_> response;
  future<void> startedListeningFuture;
  string namedPipe;
  ResponseOrError<dap::DisconnectResponse> disconnectResponse;
  ResponseOrError<dap::ConfigurationDoneResponse> configurationDoneResponse;
  LaunchRequest launchRequest;
  future<bool> disconnectResponseReceivedFuture;
  future<bool> threadExitedFuture;
  future<bool> threadStartedFuture;
  future<bool> terminatedEventReceivedFuture;
  future<bool> exitedEventReceivedFuture;
  future<bool> initializedEventReceivedFuture;
  future<bool> debuggerAdapterInitializedFuture;
  future<void> debuggerConnectionCreatedFuture;
  promise<bool> disconnectResponseReceivedPromise;
  promise<bool> threadStartedPromise;
  promise<bool> debuggerAdapterInitializedPromise;
  promise<bool> threadExitedPromise;
  promise<bool> terminatedEventReceivedPromise;
  promise<bool> exitedEventReceivedPromise;
  promise<bool> initializedEventReceivedPromise;
  DisconnectRequest disconnectRequest;
  ResponseOrError<dap::LaunchResponse> launchResponse;
  promise<void> debuggerConnectionCreatedPromise;
  CMakeInitializeRequest initializeRequest;
  ResponseOrError<dap::CMakeInitializeResponse> initializeResponse;
  CMakeInitializeRequest *local_598;
  duration<long,_std::ratio<1L,_1L>_> local_590 [2];
  cmDebuggerPipeClient_POSIX *local_580;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_578;
  ScopedThread local_570;
  Session local_568;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_560;
  _State_baseV2 *local_558;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_550;
  future<dap::ResponseOrError<dap::DisconnectResponse>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  ResponseOrError<dap::DisconnectResponse> local_510;
  ResponseOrError<dap::ConfigurationDoneResponse> local_4e8;
  undefined1 local_4c0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4b8;
  __basic_future<bool> local_478;
  __basic_future<bool> local_468;
  __basic_future<bool> local_458;
  __basic_future<bool> local_448;
  __basic_future<bool> local_438;
  __basic_future<bool> local_428;
  __basic_future<bool> local_418;
  __basic_future<void> local_408;
  promise<bool> local_3f8;
  promise<bool> local_3e0;
  promise<bool> local_3c8;
  promise<bool> local_3b0;
  promise<bool> local_398;
  promise<bool> local_380;
  promise<bool> local_368;
  undefined4 local_350;
  undefined2 local_34c;
  ResponseOrError<dap::LaunchResponse> local_348;
  promise<void> local_320;
  cmDebuggerPipeClient_POSIX *local_308;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_300;
  undefined1 local_2f8 [33];
  undefined7 uStack_2d7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined8 local_2b8;
  promise<bool> local_2b0;
  undefined4 local_298;
  CMakeInitializeRequest *local_290;
  undefined8 local_288;
  undefined1 local_280 [41];
  undefined7 uStack_257;
  undefined1 local_248;
  undefined8 local_240;
  _Alloc_hider _Stack_238;
  undefined2 local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  code *local_218;
  code *pcStack_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0 [4];
  char local_189;
  long local_88;
  long local_80;
  long local_78;
  char local_70 [32];
  char *local_50;
  long local_48;
  char local_40 [16];
  
  this = &local_320;
  std::promise<void>::promise(this);
  std::__basic_future<void>::__basic_future(&local_408,&this->_M_future);
  local_558 = (_State_baseV2 *)0x0;
  p_Stack_550 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::promise<bool>::promise(&local_3c8);
  std::__basic_future<bool>::__basic_future(&local_418,&local_3c8._M_future);
  std::promise<bool>::promise(&local_368);
  std::__basic_future<bool>::__basic_future(&local_428,&local_368._M_future);
  std::promise<bool>::promise(&local_380);
  std::__basic_future<bool>::__basic_future(&local_438,&local_380._M_future);
  std::promise<bool>::promise(&local_398);
  __state = &local_398;
  std::__basic_future<bool>::__basic_future(&local_448,&__state->_M_future);
  std::promise<bool>::promise(&local_3e0);
  std::__basic_future<bool>::__basic_future(&local_458,&local_3e0._M_future);
  std::promise<bool>::promise(&local_3b0);
  std::__basic_future<bool>::__basic_future(&local_468,&local_3b0._M_future);
  std::promise<bool>::promise(&local_3f8);
  std::__basic_future<bool>::__basic_future(&local_478,&local_3f8._M_future);
  local_590[0].__r = 0x3c;
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"CMakeDebuggerPipe2","");
  dap::Session::create();
  pTVar4 = dap::TypeOf<dap::InitializedEvent>::type();
  local_228._8_8_ = 0;
  pcStack_210 = std::
                _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
                ::_M_invoke;
  local_218 = std::
              _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
              ::_M_manager;
  local_228._M_allocated_capacity = (size_type)&local_368;
  (**(code **)((local_598->adapterID)._M_dataplus._M_p + 0x40))(local_598,pTVar4);
  if (local_218 != (code *)0x0) {
    (*local_218)(&local_228,&local_228,3);
  }
  pTVar4 = dap::TypeOf<dap::ExitedEvent>::type();
  local_228._8_8_ = 0;
  pcStack_210 = std::
                _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
                ::_M_invoke;
  local_218 = std::
              _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
              ::_M_manager;
  local_228._M_allocated_capacity = (size_type)&local_380;
  (**(code **)((local_598->adapterID)._M_dataplus._M_p + 0x40))(local_598,pTVar4);
  if (local_218 != (code *)0x0) {
    (*local_218)(&local_228,&local_228,3);
  }
  pTVar4 = dap::TypeOf<dap::TerminatedEvent>::type();
  local_228._8_8_ = 0;
  pcStack_210 = std::
                _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
                ::_M_invoke;
  local_218 = std::
              _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
              ::_M_manager;
  local_228._M_allocated_capacity = (size_type)__state;
  (**(code **)((local_598->adapterID)._M_dataplus._M_p + 0x40))(local_598,pTVar4);
  if (local_218 != (code *)0x0) {
    (*local_218)(&local_228,&local_228,3);
  }
  local_228._M_allocated_capacity = (size_type)&local_3e0;
  local_228._8_8_ = &local_3b0;
  pTVar4 = dap::TypeOf<dap::ThreadEvent>::type();
  pcStack_210 = std::
                _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
                ::_M_invoke;
  local_218 = std::
              _Function_handler<void_(const_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:397:13)>
              ::_M_manager;
  (**(code **)((local_598->adapterID)._M_dataplus._M_p + 0x40))(local_598,pTVar4);
  if (local_218 != (code *)0x0) {
    (*local_218)(&local_228,&local_228,3);
  }
  local_570.Thread._M_id._M_thread = (thread)(id)0x0;
  local_228._M_allocated_capacity = (size_type)operator_new(0x38);
  *(undefined ***)local_228._M_allocated_capacity = &PTR___State_00bb86c0;
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
   (local_228._M_allocated_capacity + 8) = &local_530;
  *(_State_baseV2 ***)(local_228._M_allocated_capacity + 0x10) = &local_558;
  *(promise<void> **)(local_228._M_allocated_capacity + 0x18) = this;
  *(promise<bool> **)(local_228._M_allocated_capacity + 0x20) = &local_3c8;
  *(__basic_future<bool> **)(local_228._M_allocated_capacity + 0x28) = &local_478;
  *(duration<long,_std::ratio<1L,_1L>_> **)(local_228._M_allocated_capacity + 0x30) = local_590;
  std::thread::_M_start_thread(&local_570,&local_228,0);
  if ((long *)local_228._M_allocated_capacity != (long *)0x0) {
    (**(code **)(*(long *)local_228._M_allocated_capacity + 8))();
  }
  if (local_408._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (_State_baseV2 *)0x0) {
LAB_001f7ea7:
    std::__throw_future_error(3);
    pCVar7 = local_598;
LAB_001f7eb1:
    fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>(&local_438,local_590);
    if (fVar2 == ready) {
      local_34c = 0;
      local_350 = 0;
      dap::Session::send<dap::DisconnectRequest,void>
                ((Session *)&local_540,(DisconnectRequest *)local_598);
      dap::future<dap::ResponseOrError<dap::DisconnectResponse>_>::get(&local_510,&local_540);
      if (local_540.state.
          super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::DisconnectResponse>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_540.state.
                   super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::DisconnectResponse>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      local_540.state.
      super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::DisconnectResponse>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_1_ = 1;
      std::promise<bool>::set_value(&local_3f8,(bool *)&local_540);
      bVar9 = local_510.error.message._M_string_length == 0;
      if (!bVar9) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(!disconnectResponse.error) failed on line ",
                   0x36);
        poVar5 = (ostream *)std::ostream::operator<<(&std::cout,0xb0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510.error.message._M_dataplus._M_p != &local_510.error.message.field_2) {
        operator_delete(local_510.error.message._M_dataplus._M_p,
                        local_510.error.message.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      iVar3 = 0xab;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ASSERT_TRUE(exitedEventReceivedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                 ,0x6b);
LAB_001f7ee8:
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      bVar9 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8.error.message._M_dataplus._M_p != &local_4e8.error.message.field_2) {
      operator_delete(local_4e8.error.message._M_dataplus._M_p,
                      local_4e8.error.message.field_2._M_allocated_capacity + 1);
    }
LAB_001f7f2d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.error.message._M_dataplus._M_p != &local_348.error.message.field_2) {
      operator_delete(local_348.error.message._M_dataplus._M_p,
                      local_348.error.message.field_2._M_allocated_capacity + 1);
    }
    dap::LaunchRequest::~LaunchRequest((LaunchRequest *)local_4c0);
  }
  else {
    fVar2 = std::__future_base::_State_baseV2::wait_for<long,std::ratio<1l,1l>>
                      (local_408._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,local_590);
    if (fVar2 != ready) {
      iVar3 = 0x7f;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ASSERT_TRUE(debuggerConnectionCreatedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                 ,0x71);
LAB_001f763c:
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      bVar9 = false;
      goto LAB_001f7660;
    }
    if (local_558 == (_State_baseV2 *)0x0) goto LAB_001f7ea7;
    fVar2 = std::__future_base::_State_baseV2::wait_for<long,std::ratio<1l,1l>>(local_558,local_590)
    ;
    if (fVar2 != ready) {
      iVar3 = 0x81;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ASSERT_TRUE(startedListeningFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                 ,0x68);
      goto LAB_001f763c;
    }
    std::__shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<cmDebugger::cmDebuggerPipeClient_POSIX>,std::__cxx11::string&>
              ((__shared_ptr<cmDebugger::cmDebuggerPipeClient_POSIX,(__gnu_cxx::_Lock_policy)2> *)
               &local_580,(allocator<cmDebugger::cmDebuggerPipeClient_POSIX> *)&local_228,&local_530
              );
    cmDebugger::cmDebuggerPipeClient_POSIX::WaitForConnection(local_580);
    local_308 = local_580;
    local_300 = local_578;
    if (local_578 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_4c0 = (undefined1  [8])&(local_580->super_ReaderWriter).super_Writer;
      if (local_580 == (cmDebuggerPipeClient_POSIX *)0x0) {
        local_4c0 = (undefined1  [8])local_580;
      }
      local_4b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_578->_M_use_count = local_578->_M_use_count + 1;
        UNLOCK();
        local_4c0 = (undefined1  [8])&(local_580->super_ReaderWriter).super_Writer;
        if (local_580 == (cmDebuggerPipeClient_POSIX *)0x0) {
          local_4c0 = (undefined1  [8])local_580;
        }
        local_4b8 = local_578;
        if (local_578 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001f787d;
      }
      else {
        local_578->_M_use_count = local_578->_M_use_count + 1;
        local_4c0 = (undefined1  [8])&(local_580->super_ReaderWriter).super_Writer;
        if (local_580 == (cmDebuggerPipeClient_POSIX *)0x0) {
          local_4c0 = (undefined1  [8])local_580;
        }
      }
      local_4b8 = local_578;
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_578->_M_use_count = local_578->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_578->_M_use_count = local_578->_M_use_count + 1;
      }
    }
LAB_001f787d:
    local_218 = (code *)0x0;
    pcStack_210 = (code *)0x0;
    local_228._M_allocated_capacity = 0;
    local_228._8_8_ = (promise<bool> *)0x0;
    (**(code **)((local_598->adapterID)._M_dataplus._M_p + 0x20))(local_598,&local_308,local_4c0);
    (**(code **)((local_598->adapterID)._M_dataplus._M_p + 0x28))(local_598,&local_228);
    if (local_218 != (code *)0x0) {
      (*local_218)(&local_228,&local_228,3);
    }
    if (local_4b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4b8);
    }
    if (local_300 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_300);
    }
    local_308 = (cmDebuggerPipeClient_POSIX *)local_2f8;
    local_300 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2f8[0] = 0;
    local_2f8._16_8_ = local_2f8 + 0x20;
    local_2f8._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2f8[0x20] = 0;
    local_2c8._M_local_buf[0] = '\0';
    __state = &local_2b0;
    local_2b8._0_4_ = 0;
    local_2b8._4_4_ = 0;
    local_2b0._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
         0;
    local_2b0._M_storage._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<bool>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<bool>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<bool>_*,_false>._M_head_impl._0_1_ = 0;
    pCVar7 = (CMakeInitializeRequest *)local_280;
    local_298 = 0;
    local_288 = 0;
    local_280[0] = 0;
    local_280[0x10] = '\0';
    this = (promise<void> *)(local_280 + 0x28);
    local_280._32_8_ = (pointer)0x0;
    local_280[0x28] = 0;
    local_248 = '\0';
    local_240._0_1_ = false;
    local_240._1_7_ = 0;
    _Stack_238._M_p = (pointer)0x0;
    local_230 = 0;
    local_2c8._8_8_ = __state;
    local_290 = pCVar7;
    local_280._24_8_ = this;
    dap::Session::send<dap::CMakeInitializeRequest,void>(&local_568,local_598);
    local_4c0 = (undefined1  [8])(local_568._vptr_Session + 0x3f);
    local_4b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((ulong)local_4b8 & 0xffffffffffffff00);
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_4c0);
    local_4b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_4b8._1_7_,true);
    SVar6._vptr_Session = local_568._vptr_Session;
    if (*(char *)(local_568._vptr_Session + 0x4a) == '\0') {
      puVar8 = (unique_lock *)(local_568._vptr_Session + 0x44);
      do {
        std::condition_variable::wait(puVar8);
        SVar6._vptr_Session = local_568._vptr_Session;
      } while (*(char *)(local_568._vptr_Session + 0x4a) != '\x01');
    }
    dap::CMakeInitializeResponse::CMakeInitializeResponse
              ((CMakeInitializeResponse *)&local_228,(CMakeInitializeResponse *)SVar6._vptr_Session)
    ;
    local_50 = local_40;
    pCVar1 = (((CMakeInitializeResponse *)((long)SVar6._vptr_Session + 0x1d8))->
             additionalModuleColumns).val.
             super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>.
             _M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pCVar1,
               (long)&(((((CMakeInitializeResponse *)((long)SVar6._vptr_Session + 0x1d8))->
                        additionalModuleColumns).val.
                        super__Vector_base<dap::ColumnDescriptor,_std::allocator<dap::ColumnDescriptor>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->attributeName)._M_dataplus._M_p
               + (long)pCVar1);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_4c0);
    if (local_48 == 0) {
      iVar3 = std::__cxx11::string::compare(local_70);
      if (iVar3 == 0) {
        if (local_88 == 3) {
          if (local_80 == 0x1d) {
            if (local_78 == 0x134d7ca) {
              if (local_189 == '\0') {
                iVar3 = 0x94;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "ASSERT_TRUE(initializeResponse.response.supportsExceptionInfoRequest) failed on line "
                           ,0x55);
              }
              else {
                if (local_1d0[0]._M_local_buf[0] != '\0') {
                  dap::LaunchRequest::LaunchRequest((LaunchRequest *)local_4c0);
                  dap::Session::send<dap::LaunchRequest,void>
                            ((Session *)&local_4e8,(LaunchRequest *)local_598);
                  dap::future<dap::ResponseOrError<dap::LaunchResponse>_>::get
                            (&local_348,
                             (future<dap::ResponseOrError<dap::LaunchResponse>_> *)&local_4e8);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_4e8.error.message._M_dataplus._M_p !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_4e8.error.message._M_dataplus._M_p);
                  }
                  if (local_348.error.message._M_string_length == 0) {
                    dap::Session::send<dap::ConfigurationDoneRequest,void>
                              ((Session *)&local_510,(ConfigurationDoneRequest *)local_598);
                    dap::future<dap::ResponseOrError<dap::ConfigurationDoneResponse>_>::get
                              (&local_4e8,
                               (future<dap::ResponseOrError<dap::ConfigurationDoneResponse>_> *)
                               &local_510);
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        local_510.error.message._M_dataplus._M_p !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_510.error.message._M_dataplus._M_p);
                    }
                    if (local_4e8.error.message._M_string_length == 0) {
                      fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                                        (&local_418,local_590);
                      if (fVar2 == ready) {
                        fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                                          (&local_428,local_590);
                        if (fVar2 == ready) {
                          fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                                            (&local_448,local_590);
                          if (fVar2 == ready) {
                            fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                                              (&local_458,local_590);
                            if (fVar2 == ready) {
                              fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1l>>
                                                (&local_468,local_590);
                              if (fVar2 == ready) goto LAB_001f7eb1;
                              iVar3 = 0xa9;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,
                                         "ASSERT_TRUE(threadExitedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                         ,100);
                            }
                            else {
                              iVar3 = 0xa7;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,
                                         "ASSERT_TRUE(threadStartedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                         ,0x65);
                            }
                          }
                          else {
                            iVar3 = 0xa5;
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       "ASSERT_TRUE(terminatedEventReceivedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                       ,0x6f);
                          }
                        }
                        else {
                          iVar3 = 0xa3;
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "ASSERT_TRUE(initializedEventReceivedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                     ,0x70);
                        }
                      }
                      else {
                        iVar3 = 0xa1;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "ASSERT_TRUE(debuggerAdapterInitializedFuture.wait_for(futureTimeout) == std::future_status::ready) failed on line "
                                   ,0x72);
                      }
                    }
                    else {
                      iVar3 = 0x9e;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "ASSERT_TRUE(!configurationDoneResponse.error) failed on line ",
                                 0x3d);
                    }
                    goto LAB_001f7ee8;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "ASSERT_TRUE(!launchResponse.error) failed on line ",0x32);
                  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,0x99);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
                  bVar9 = false;
                  goto LAB_001f7f2d;
                }
                iVar3 = 0x96;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "ASSERT_TRUE(initializeResponse.response.exceptionBreakpointFilters.has_value()) failed on line "
                           ,0x5f);
              }
            }
            else {
              iVar3 = 0x93;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "ASSERT_TRUE(initializeResponse.response.cmakeVersion.patch == CMake_VERSION_PATCH) failed on line "
                         ,0x62);
            }
          }
          else {
            iVar3 = 0x91;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "ASSERT_TRUE(initializeResponse.response.cmakeVersion.minor == CMake_VERSION_MINOR) failed on line "
                       ,0x62);
          }
        }
        else {
          iVar3 = 0x8f;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(initializeResponse.response.cmakeVersion.major == CMake_VERSION_MAJOR) failed on line "
                     ,0x62);
        }
      }
      else {
        iVar3 = 0x8d;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "ASSERT_TRUE(initializeResponse.response.cmakeVersion.full == CMake_VERSION) failed on line "
                   ,0x5b);
      }
    }
    else {
      iVar3 = 0x8c;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(!initializeResponse.error) failed on line ",0x36
                );
    }
    poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    bVar9 = false;
  }
  dap::ResponseOrError<dap::CMakeInitializeResponse>::~ResponseOrError
            ((ResponseOrError<dap::CMakeInitializeResponse> *)&local_228);
  if (local_560 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_560);
  }
  if ((promise<void> *)local_280._24_8_ != this) {
    operator_delete((void *)local_280._24_8_,CONCAT71(uStack_257,local_280[0x28]) + 1);
  }
  if (local_290 != pCVar7) {
    operator_delete(local_290,CONCAT71(local_280._1_7_,local_280[0]) + 1);
  }
  if ((promise<bool> *)local_2c8._8_8_ != __state) {
    operator_delete((void *)local_2c8._8_8_,
                    CONCAT71(local_2b0._M_future.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr._1_7_,
                             local_2b0._M_future.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr._0_1_) + 1);
  }
  if ((element_type *)local_2f8._16_8_ != (element_type *)(local_2f8 + 0x20)) {
    operator_delete((void *)local_2f8._16_8_,CONCAT71(uStack_2d7,local_2f8[0x20]) + 1);
  }
  if (local_308 != (cmDebuggerPipeClient_POSIX *)local_2f8) {
    operator_delete(local_308,CONCAT71(local_2f8._1_7_,local_2f8[0]) + 1);
  }
  if (local_578 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_578);
  }
LAB_001f7660:
  ScopedThread::~ScopedThread(&local_570);
  if (local_598 != (CMakeInitializeRequest *)0x0) {
    (**(code **)((local_598->adapterID)._M_dataplus._M_p + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  if (local_478._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_478._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<bool>::~promise(&local_3f8);
  if (local_468._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_468._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<bool>::~promise(&local_3b0);
  if (local_458._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_458._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<bool>::~promise(&local_3e0);
  if (local_448._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_448._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<bool>::~promise(&local_398);
  if (local_438._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_438._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<bool>::~promise(&local_380);
  if (local_428._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_428._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<bool>::~promise(&local_368);
  if (local_418._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_418._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<bool>::~promise(&local_3c8);
  if (p_Stack_550 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_550);
  }
  if (local_408._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_408._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<void>::~promise(&local_320);
  return bVar9;
}

Assistant:

bool testProtocolWithPipes()
{
  std::promise<void> debuggerConnectionCreatedPromise;
  std::future<void> debuggerConnectionCreatedFuture =
    debuggerConnectionCreatedPromise.get_future();

  std::future<void> startedListeningFuture;

  std::promise<bool> debuggerAdapterInitializedPromise;
  std::future<bool> debuggerAdapterInitializedFuture =
    debuggerAdapterInitializedPromise.get_future();

  std::promise<bool> initializedEventReceivedPromise;
  std::future<bool> initializedEventReceivedFuture =
    initializedEventReceivedPromise.get_future();

  std::promise<bool> exitedEventReceivedPromise;
  std::future<bool> exitedEventReceivedFuture =
    exitedEventReceivedPromise.get_future();

  std::promise<bool> terminatedEventReceivedPromise;
  std::future<bool> terminatedEventReceivedFuture =
    terminatedEventReceivedPromise.get_future();

  std::promise<bool> threadStartedPromise;
  std::future<bool> threadStartedFuture = threadStartedPromise.get_future();

  std::promise<bool> threadExitedPromise;
  std::future<bool> threadExitedFuture = threadExitedPromise.get_future();

  std::promise<bool> disconnectResponseReceivedPromise;
  std::future<bool> disconnectResponseReceivedFuture =
    disconnectResponseReceivedPromise.get_future();

  auto futureTimeout = std::chrono::seconds(60);

#ifdef _WIN32
  std::string namedPipe = R"(\\.\pipe\LOCAL\CMakeDebuggerPipe2_)" +
    cmCryptoHash(cmCryptoHash::AlgoSHA256)
      .HashString(cmSystemTools::GetCurrentWorkingDirectory());
#else
  std::string namedPipe = "CMakeDebuggerPipe2";
#endif

  std::unique_ptr<dap::Session> client = dap::Session::create();
  client->registerHandler([&](const dap::InitializedEvent& e) {
    (void)e;
    initializedEventReceivedPromise.set_value(true);
  });
  client->registerHandler([&](const dap::ExitedEvent& e) {
    (void)e;
    exitedEventReceivedPromise.set_value(true);
  });
  client->registerHandler([&](const dap::TerminatedEvent& e) {
    (void)e;
    terminatedEventReceivedPromise.set_value(true);
  });
  client->registerHandler([&](const dap::ThreadEvent& e) {
    if (e.reason == "started") {
      threadStartedPromise.set_value(true);
    } else if (e.reason == "exited") {
      threadExitedPromise.set_value(true);
    }
  });

  ScopedThread debuggerThread([&]() -> int {
    try {
      auto connection =
        std::make_shared<cmDebugger::cmDebuggerPipeConnection>(namedPipe);
      startedListeningFuture = connection->StartedListening.get_future();
      debuggerConnectionCreatedPromise.set_value();
      std::shared_ptr<cmDebugger::cmDebuggerAdapter> debuggerAdapter =
        std::make_shared<cmDebugger::cmDebuggerAdapter>(
          connection, dap::file(stdout, false));

      debuggerAdapterInitializedPromise.set_value(true);
      debuggerAdapter->ReportExitCode(0);

      // Ensure the disconnectResponse has been received before
      // destructing debuggerAdapter.
      ASSERT_TRUE(disconnectResponseReceivedFuture.wait_for(futureTimeout) ==
                  std::future_status::ready);
      return 0;
    } catch (const std::runtime_error& error) {
      std::cerr << "Error: Failed to create debugger adapter.\n";
      std::cerr << error.what() << "\n";
      return -1;
    }
  });

  ASSERT_TRUE(debuggerConnectionCreatedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(startedListeningFuture.wait_for(futureTimeout) ==
              std::future_status::ready);

  auto client2Debugger =
    std::make_shared<cmDebugger::cmDebuggerPipeClient>(namedPipe);

  client2Debugger->WaitForConnection();
  client->bind(client2Debugger, client2Debugger);

  dap::CMakeInitializeRequest initializeRequest;
  auto response = client->send(initializeRequest);
  auto initializeResponse = response.get();
  ASSERT_TRUE(!initializeResponse.error);
  ASSERT_TRUE(initializeResponse.response.cmakeVersion.full == CMake_VERSION);
  ASSERT_TRUE(initializeResponse.response.cmakeVersion.major ==
              CMake_VERSION_MAJOR);
  ASSERT_TRUE(initializeResponse.response.cmakeVersion.minor ==
              CMake_VERSION_MINOR);
  ASSERT_TRUE(initializeResponse.response.cmakeVersion.patch ==
              CMake_VERSION_PATCH);
  ASSERT_TRUE(initializeResponse.response.supportsExceptionInfoRequest);
  ASSERT_TRUE(
    initializeResponse.response.exceptionBreakpointFilters.has_value());
  dap::LaunchRequest launchRequest;
  auto launchResponse = client->send(launchRequest).get();
  ASSERT_TRUE(!launchResponse.error);

  dap::ConfigurationDoneRequest configurationDoneRequest;
  auto configurationDoneResponse =
    client->send(configurationDoneRequest).get();
  ASSERT_TRUE(!configurationDoneResponse.error);

  ASSERT_TRUE(debuggerAdapterInitializedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(initializedEventReceivedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(terminatedEventReceivedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(threadStartedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(threadExitedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);
  ASSERT_TRUE(exitedEventReceivedFuture.wait_for(futureTimeout) ==
              std::future_status::ready);

  dap::DisconnectRequest disconnectRequest;
  auto disconnectResponse = client->send(disconnectRequest).get();
  disconnectResponseReceivedPromise.set_value(true);
  ASSERT_TRUE(!disconnectResponse.error);

  return true;
}